

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

void noise_get_heavy(_func_void_void_ptr_int *func)

{
  int __fd;
  ssize_t sVar1;
  FILE *pFVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char buf [512];
  
  uVar7 = 0;
  __fd = open("/dev/urandom",0);
  if (-1 < __fd) {
    do {
      iVar6 = (int)uVar7;
      if (0x1f < iVar6) {
        close(__fd);
        (*func)(buf,0x20);
        uVar7 = 1;
        goto LAB_0012ae14;
      }
      sVar1 = read(__fd,buf + uVar7,(ulong)(0x20 - iVar6));
      uVar7 = (ulong)(uint)(iVar6 + (int)sVar1);
    } while (-1 < (int)sVar1);
    close(__fd);
    uVar7 = 0;
  }
LAB_0012ae14:
  pFVar2 = popen("ps -axu 2>/dev/null","r");
  if (pFVar2 == (FILE *)0x0) {
    if ((char)uVar7 == '\0') goto LAB_0012aed0;
  }
  else {
    while (sVar3 = fread(buf,1,0x200,pFVar2), 0 < (int)sVar3) {
      (*func)(buf,(int)sVar3);
    }
    pclose(pFVar2);
  }
  pFVar2 = popen("ls -al /tmp 2>/dev/null","r");
  if (pFVar2 == (FILE *)0x0) {
    if ((char)uVar7 == '\0') {
LAB_0012aed0:
      pFVar2 = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar2,"popen: %s\nUnable to access fallback entropy source\n",pcVar5);
      exit(1);
    }
  }
  else {
    while (sVar3 = fread(buf,1,0x200,pFVar2), 0 < (int)sVar3) {
      (*func)(buf,(int)sVar3);
    }
    pclose(pFVar2);
  }
  read_random_seed(func);
  return;
}

Assistant:

void noise_get_heavy(void (*func) (void *, int))
{
    char buf[512];
    FILE *fp;
    int ret;
    bool got_dev_urandom = false;

    if (read_dev_urandom(buf, 32)) {
        got_dev_urandom = true;
        func(buf, 32);
    }

    fp = popen("ps -axu 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    fp = popen("ls -al /tmp 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    read_random_seed(func);
}